

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void testing::internal::
     SharedPayload<testing::internal::EqMatcher<std::pair<phmap::priv::NonStandardLayout,_int>_>_>::
     Destroy(SharedPayloadBase *shared)

{
  if (shared != (SharedPayloadBase *)0x0) {
    phmap::priv::NonStandardLayout::~NonStandardLayout((NonStandardLayout *)(shared + 2));
  }
  operator_delete(shared,0x38);
  return;
}

Assistant:

static void Destroy(SharedPayloadBase* shared) {
    delete static_cast<SharedPayload*>(shared);
  }